

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int as154_seas(double *inp,int N,int optmethod,int p,int d,int q,int s,int P,int D,int Q,double *phi
              ,double *theta,double *PHI,double *THETA,double *wmean,double *var,double *loglik,
              double *hess,int cssml)

{
  size_t __size;
  double *THETA_00;
  void *__ptr;
  int iVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  reg_object obj;
  alik_seas_object paVar6;
  int *ipiv;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  undefined1 local_e8 [8];
  custom_function as154_min;
  int local_bc;
  int local_b8;
  int p_local;
  int q_local;
  double *local_a8;
  alik_seas_object local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double local_60;
  uint local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  int local_34;
  
  iVar1 = Q;
  uVar14 = (ulong)(uint)q;
  uVar8 = (ulong)(uint)p;
  local_78 = (double *)CONCAT44(local_78._4_4_,optmethod);
  uVar12 = (ulong)(uint)Q;
  local_50 = (ulong)(uint)P;
  p_local = D * s;
  local_bc = p;
  local_b8 = q;
  local_34 = d;
  local_70 = (double *)malloc((long)(N - p_local) << 3);
  iVar13 = local_34;
  THETA_00 = THETA;
  pdVar5 = PHI;
  pdVar4 = theta;
  pdVar3 = phi;
  local_68 = inp;
  local_48 = uVar14;
  local_40 = uVar12;
  if (cssml == 1) {
    local_88 = uVar8;
    local_54 = N;
    css_seas(inp,N,(int)local_78,p,local_34,q,s,(int)local_50,D,iVar1,phi,theta,PHI,THETA,wmean,var,
             loglik,hess);
    iVar1 = checkroots_cerr(pdVar3,&local_bc,pdVar4,&local_b8,pdVar5,&P,THETA_00,&Q);
    if (iVar1 == 10) {
      return 10;
    }
    if (iVar1 == 0xc) {
      return 0xc;
    }
    local_60 = *wmean;
    iVar1 = (int)local_48;
    uVar8 = local_88;
    N = local_54;
    iVar13 = local_34;
  }
  else {
    if (0 < p) {
      memset(phi,0,uVar8 << 3);
    }
    uVar12 = local_50;
    iVar1 = (int)local_48;
    if (0 < iVar1) {
      memset(theta,0,(local_48 & 0xffffffff) << 3);
    }
    if (0 < (int)uVar12) {
      memset(PHI,0,(uVar12 & 0xffffffff) << 3);
    }
    local_60 = 0.0;
    if (0 < (int)local_40) {
      memset(THETA,0,(local_40 & 0xffffffff) << 3);
    }
  }
  if (D < 1) {
    uVar12 = (ulong)(uint)N;
    if (0 < N) {
      memcpy(local_70,local_68,(ulong)(uint)N << 3);
      uVar12 = (ulong)(uint)N;
    }
  }
  else {
    uVar2 = diffs(local_68,N,D,s,local_70);
    uVar12 = (ulong)uVar2;
  }
  uVar2 = iVar1 + (int)uVar8;
  local_98 = (ulong)uVar2;
  uVar2 = uVar2 + (int)local_50;
  _q_local = (ulong)uVar2;
  if (((D == 0 && iVar13 == 0) && -(int)local_40 == uVar2) && cssml == 1) {
    free(local_70);
    local_60._0_4_ = 1;
  }
  else {
    iVar9 = (int)uVar12;
    local_54 = N;
    pdVar3 = (double *)malloc((long)(iVar9 - iVar13) << 3);
    if (iVar13 < 1) {
      if (0 < iVar9) {
        memcpy(pdVar3,local_70,uVar12 << 3);
      }
    }
    else {
      uVar2 = diff(local_70,iVar9,iVar13,pdVar3);
      uVar12 = (ulong)uVar2;
    }
    local_90 = uVar12;
    local_88 = uVar8;
    if (D + iVar13 == 0) {
      pdVar4 = (double *)malloc(8);
      pdVar5 = (double *)malloc((long)(int)uVar12 * 8);
      obj = reg_init((int)uVar12,1);
      setIntercept(obj,1);
      regress(obj,(double *)0x0,pdVar3,pdVar5,pdVar4,0.95);
      local_60 = obj->beta[0].value;
      iVar1 = (int)local_48;
      free(pdVar4);
      uVar8 = local_88;
      uVar12 = local_90;
      free(pdVar5);
      iVar13 = local_34;
      free_reg(obj);
    }
    iVar9 = (int)uVar8;
    as154_min.params = pdVar3;
    paVar6 = alik_seas_init(iVar9,iVar13,iVar1,s,(int)local_50,D,(int)local_40,(int)uVar12);
    iVar1 = paVar6->pq;
    lVar11 = (long)iVar1;
    __size = lVar11 * 8;
    local_a8 = (double *)malloc(__size);
    local_68 = (double *)malloc(__size);
    pdVar3 = (double *)malloc(__size * lVar11);
    pdVar4 = (double *)malloc(__size);
    ipiv = (int *)malloc(lVar11 * 4);
    paVar6->N = (int)local_90;
    iVar13 = paVar6->offset;
    local_a0 = paVar6;
    if (0 < iVar9) {
      memcpy(local_a8,phi,(uVar8 & 0xffffffff) << 3);
    }
    pdVar5 = local_a8;
    __ptr = as154_min.params;
    local_80 = (long)iVar9;
    if (0 < (int)local_48) {
      uVar8 = 0;
      do {
        local_a8[local_80 + uVar8] = -theta[uVar8];
        uVar8 = uVar8 + 1;
      } while ((local_48 & 0xffffffff) != uVar8);
    }
    local_98 = (ulong)(int)local_98;
    if (0 < (int)local_50) {
      uVar8 = 0;
      do {
        local_a8[local_98 + uVar8] = PHI[uVar8];
        uVar8 = uVar8 + 1;
      } while ((local_50 & 0xffffffff) != uVar8);
    }
    lVar10 = (long)q_local;
    if (0 < (int)local_40) {
      uVar8 = 0;
      do {
        local_a8[lVar10 + uVar8] = -THETA[uVar8];
        uVar8 = uVar8 + 1;
      } while ((local_40 & 0xffffffff) != uVar8);
    }
    if (local_a0->M == 1) {
      local_a8[(int)local_40 + q_local] = local_60;
    }
    local_a0->mean = local_60;
    iVar9 = (int)local_90;
    if (0 < iVar9) {
      uVar8 = 0;
      do {
        dVar15 = *(double *)((long)as154_min.params + uVar8 * 8);
        local_a0->x[(long)(iVar13 + iVar9 * 2) + uVar8] = dVar15;
        local_a0->x[(long)iVar13 + uVar8] = dVar15;
        uVar8 = uVar8 + 1;
      } while ((local_90 & 0xffffffff) != uVar8);
    }
    if (iVar9 < iVar9 * 2) {
      memset(local_a0->x + (iVar13 + iVar9),0,(ulong)(iVar9 - 1) * 8 + 8);
    }
    paVar6 = local_a0;
    local_e8 = (undefined1  [8])fas154_seas;
    as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)local_a0;
    uVar2 = fminunc((custom_function *)local_e8,(custom_gradient *)0x0,iVar1,pdVar5,1.0,
                    (int)local_78,local_68);
    if ((0xf < uVar2) || ((0x8011U >> (uVar2 & 0x1f) & 1) == 0)) {
      uVar2 = 1;
    }
    local_60 = (double)CONCAT44(local_60._4_4_,uVar2);
    if (0 < iVar1) {
      lVar7 = 0;
      do {
        pdVar4[lVar7] = 1.0;
        lVar7 = lVar7 + 1;
      } while (lVar11 != lVar7);
    }
    local_78 = pdVar4;
    if (0 < (int)local_48) {
      invertroot((int)local_48,local_68 + local_80);
    }
    pdVar4 = local_68;
    if (0 < (int)local_40) {
      invertroot((int)local_40,local_68 + local_80 + (long)(int)local_48 + (long)(int)local_50);
    }
    pdVar5 = hess;
    hessian_fd((custom_function *)local_e8,pdVar4,iVar1,local_78,paVar6->eps,hess);
    mtranspose(pdVar5,iVar1,iVar1,pdVar3);
    if (iVar1 != 0) {
      uVar8 = 0;
      do {
        pdVar3[uVar8] =
             (pdVar5[uVar8] + pdVar3[uVar8]) * (double)(int)(local_54 - (p_local + local_34)) * 0.5;
        uVar8 = uVar8 + 1;
      } while (iVar1 * iVar1 + (uint)(iVar1 * iVar1 == 0) != uVar8);
    }
    ludecomp(pdVar3,iVar1,ipiv);
    minverse(pdVar3,iVar1,ipiv,pdVar5);
    pdVar4 = local_68;
    if (0 < (int)local_88) {
      memcpy(phi,local_68,(local_88 & 0xffffffff) << 3);
    }
    pdVar5 = local_70;
    paVar6 = local_a0;
    if (0 < (int)local_48) {
      uVar8 = 0;
      do {
        theta[uVar8] = -pdVar4[local_80 + uVar8];
        uVar8 = uVar8 + 1;
      } while ((local_48 & 0xffffffff) != uVar8);
    }
    if (0 < (int)local_50) {
      uVar8 = 0;
      do {
        PHI[uVar8] = pdVar4[local_98 + uVar8];
        uVar8 = uVar8 + 1;
      } while ((local_50 & 0xffffffff) != uVar8);
    }
    if (0 < (int)local_40) {
      uVar8 = 0;
      do {
        THETA[uVar8] = -pdVar4[lVar10 + uVar8];
        uVar8 = uVar8 + 1;
      } while ((local_40 & 0xffffffff) != uVar8);
    }
    dVar15 = 0.0;
    if (local_a0->M == 1) {
      dVar15 = pdVar4[(int)_q_local + (int)local_40];
    }
    *wmean = dVar15;
    *var = local_a0->ssq / (double)(int)local_90;
    *loglik = local_a0->loglik;
    free(local_a8);
    free(pdVar4);
    free(pdVar5);
    free(__ptr);
    free(local_78);
    free(pdVar3);
    free(ipiv);
    free(paVar6);
  }
  return local_60._0_4_;
}

Assistant:

int as154_seas(double *inp, int N, int optmethod, int p, int d, int q, int s, int P, int D, int Q,double *phi, double *theta, 
	double *PHI, double *THETA, double *wmean,double *var,double *loglik,double *hess,int cssml) {
	int i, pq, retval, length, offset,ret,nd,rp,ERR;
	double *b, *tf, *x,*inp2,*dx,*thess,*res,*varcovar;
	int *ipiv;
	double maxstep,coeff,sigma;
	alik_seas_object obj;
	reg_object fit;
	//custom_function as154_min;
	
	inp2 = (double*)malloc(sizeof(double)* (N - s*D));
	

	length = N;

	maxstep = 1.0;
	coeff = 0.0;
	sigma = 1.0;

	if (cssml == 1) {
		css_seas(inp, N, optmethod, p, d, q, s, P, D, Q, phi, theta, PHI, THETA, wmean, var, loglik, hess);

		ERR = checkroots_cerr(phi, &p, theta, &q, PHI, &P, THETA, &Q);
		if (ERR == 10 || ERR == 12) return ERR;

		coeff = *wmean;
	}
	else {
		for (i = 0; i < p; ++i) phi[i] = 0.0;
		for (i = 0; i < q; ++i) theta[i] = 0.0;
		for (i = 0; i < P; ++i) PHI[i] = 0.0;
		for (i = 0; i < Q; ++i) THETA[i] = 0.0;
	}


	/*

	*/

	nd = d + D;

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	if (p + q + P + Q == 0 && d == 0 && D == 0 && cssml == 1) {
		free(inp2);
		return 1;
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	if (nd == 0) {
		rp = 1;
		varcovar = (double*)malloc(sizeof(double) * rp * rp);
		res = (double*)malloc(sizeof(double) * N);

		fit = reg_init(N, rp);

		setIntercept(fit, 1);
		regress(fit, NULL, x, res, varcovar, 0.95);

		
		coeff = (fit->beta + 0)->value;
		sigma = 10.0 * (fit->beta + 0)->stdErr;


		free(varcovar);
		free(res);
		free_reg(fit);
	}

	obj = alik_seas_init(p, d, q, s, P, D, Q, N);
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;

	offset = obj->offset;
	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (obj->M == 1) {
		b[p + q + P + Q] = coeff;
	}

	obj->mean = coeff;

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}
	//printf("\n %d %g ", pq,maxstep);

	custom_function as154_min = { fas154_seas, obj };
	retval = fminunc(&as154_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	//Check for invertibility

	if (q > 0) {
		invertroot(q,tf+p);
	}

	if (Q > 0) {
		invertroot(Q,tf+p+q+P);
	}

	//if (obj->M == 1) dx[pq - 1] = sigma;

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}

	//mdisplay(thess,pq,pq);

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	//mdisplay(hess,pq,pq);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (obj->M == 1) {
		*wmean = tf[p + q + Q + P];
	}
	else {
		*wmean = 0.0;
	}

	*var = (obj->ssq) / (double) N;
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(inp2);
	free(x);
	free(dx);
	free(thess);
	free(ipiv);
	free_alik_seas(obj);
	return ret;
}